

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O1

unsigned_long __thiscall
gmlc::utilities::strViewToInteger<unsigned_long>
          (utilities *this,string_view input,size_t *charactersUsed)

{
  unsigned_long uVar1;
  invalid_argument *this_00;
  size_t *charactersUsed_00;
  code *pcVar2;
  undefined *puVar3;
  utilities *puVar4;
  char *__first;
  __integer_from_chars_result_type<unsigned_long> _Var5;
  string_view input_00;
  unsigned_long val;
  unsigned_long local_28;
  
  input_00._M_str = (long *)input._M_str;
  __first = (char *)input._M_len;
  local_28 = 0;
  if (input_00._M_str != (long *)0x0) {
    *input_00._M_str = 0;
  }
  puVar4 = (utilities *)0x0;
  if (this < (utilities *)0x2) goto LAB_002f2184;
  do {
    if (__first[(long)puVar4] != ' ') {
      if ((__first[(long)puVar4] != '0') || ((byte)((__first + 1)[(long)puVar4] | 0x20U) == 0x78))
      goto LAB_002f217e;
      goto LAB_002f2177;
    }
    puVar4 = puVar4 + 1;
  } while (this != puVar4);
  goto LAB_002f214e;
LAB_002f217e:
  __first = __first + (long)puVar4;
  this = this + -(long)puVar4;
LAB_002f2184:
  charactersUsed_00 = (size_t *)0xa;
  _Var5 = CLI::std::from_chars<unsigned_long>(__first,__first + (long)this,&local_28,10);
  if (_Var5.ec == 0) {
    if (input_00._M_str == (long *)0x0) {
      return local_28;
    }
    *input_00._M_str = (long)(_Var5.ptr + ((long)puVar4 - (long)__first));
    return local_28;
  }
  if (_Var5.ec == result_out_of_range) {
    if (input_00._M_str != (long *)0x0) {
      *input_00._M_str = (long)_Var5.ptr - (long)__first;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range
              ((out_of_range *)this_00,"conversion type does not support the string conversion");
    puVar3 = &std::out_of_range::typeinfo;
    pcVar2 = std::out_of_range::~out_of_range;
  }
  else {
    if (((utilities *)0x1 < this) && (*__first == '-')) {
      input_00._M_len = (size_t)__first;
      uVar1 = strViewToInteger<long>(this,input_00,charactersUsed_00);
      return uVar1;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"unable to convert string");
    puVar3 = &std::invalid_argument::typeinfo;
    pcVar2 = std::invalid_argument::~invalid_argument;
  }
  __cxa_throw(this_00,puVar3,pcVar2);
  while (puVar4 = puVar4 + 1, this != puVar4) {
LAB_002f2177:
    if (__first[(long)puVar4] != '0') goto LAB_002f217e;
  }
LAB_002f214e:
  if (input_00._M_str != (long *)0x0) {
    *input_00._M_str = (long)this;
  }
  return 0;
}

Assistant:

X strViewToInteger(std::string_view input, size_t* charactersUsed = nullptr)
{
    static_assert(std::is_integral_v<X>, "requested type is not integral");
    X val{0};
    if (charactersUsed != nullptr) {
        *charactersUsed = 0;
    }
    std::size_t additionalChars{0};
    if (input.size() > 1) {
        while (input[0] == ' ') {
            input.remove_prefix(1);
            ++additionalChars;
            if (input.empty()) {
                if (charactersUsed != nullptr) {
                    *charactersUsed = additionalChars;
                }
                return val;
            }
        }
        if (input.front() == '0') {
            if (input[1] != 'X' && input[1] != 'x') {
                while (input[0] == '0') {
                    input.remove_prefix(1);
                    ++additionalChars;
                    if (input.empty()) {
                        if (charactersUsed != nullptr) {
                            *charactersUsed = additionalChars;
                        }
                        return val;
                    }
                }
            }
        }
    }
    auto conversionResult =
        std::from_chars(input.data(), input.data() + input.size(), val);
    if (conversionResult.ec == std::errc()) {
        if (charactersUsed != nullptr) {
            *charactersUsed =
                (conversionResult.ptr - input.data()) + additionalChars;
        }
        return val;
    }
    if (conversionResult.ec == std::errc::result_out_of_range) {
        if (charactersUsed != nullptr) {
            *charactersUsed = (conversionResult.ptr - input.data());
        }
        throw(std::out_of_range(
            "conversion type does not support the string conversion"));
    }
    if constexpr (std::is_unsigned_v<X>) {
        if (input.size() > 1 && input.front() == '-') {
            auto signedVal =
                strViewToInteger<std::make_signed_t<X>>(input, charactersUsed);
            // additional chars must be 0 in this case otherwise it should have
            // been an error
            return static_cast<X>(signedVal);
        }
    }
    throw(std::invalid_argument("unable to convert string"));
}